

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::BrandedDecl::BrandedDecl(BrandedDecl *this,BrandedDecl *other)

{
  SegmentReader *pSVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  WirePointer *pWVar4;
  StructPointerCount SVar5;
  undefined2 uVar6;
  int iVar7;
  undefined4 uVar8;
  bool bVar9;
  RefOrVoid<capnp::compiler::NodeTranslator::BrandScope> object;
  Own<capnp::compiler::NodeTranslator::BrandScope> local_38 [2];
  BrandedDecl *local_18;
  BrandedDecl *other_local;
  BrandedDecl *this_local;
  
  local_18 = other;
  other_local = this;
  kj::
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  ::OneOf(&this->body,&other->body);
  kj::Own<capnp::compiler::NodeTranslator::BrandScope>::Own(&this->brand);
  pSVar1 = (local_18->source)._reader.segment;
  pCVar2 = (local_18->source)._reader.capTable;
  pvVar3 = (local_18->source)._reader.data;
  pWVar4 = (local_18->source)._reader.pointers;
  SVar5 = (local_18->source)._reader.pointerCount;
  uVar6 = *(undefined2 *)&(local_18->source)._reader.field_0x26;
  iVar7 = (local_18->source)._reader.nestingLimit;
  uVar8 = *(undefined4 *)&(local_18->source)._reader.field_0x2c;
  (this->source)._reader.dataSize = (local_18->source)._reader.dataSize;
  (this->source)._reader.pointerCount = SVar5;
  *(undefined2 *)&(this->source)._reader.field_0x26 = uVar6;
  (this->source)._reader.nestingLimit = iVar7;
  *(undefined4 *)&(this->source)._reader.field_0x2c = uVar8;
  (this->source)._reader.data = pvVar3;
  (this->source)._reader.pointers = pWVar4;
  (this->source)._reader.segment = pSVar1;
  (this->source)._reader.capTable = pCVar2;
  bVar9 = kj::
          OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
          ::is<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>(&this->body);
  if (bVar9) {
    object = kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator*(&local_18->brand);
    kj::addRef<capnp::compiler::NodeTranslator::BrandScope>((kj *)local_38,object);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::operator=(&this->brand,local_38);
    kj::Own<capnp::compiler::NodeTranslator::BrandScope>::~Own(local_38);
  }
  return;
}

Assistant:

NodeTranslator::BrandedDecl::BrandedDecl(BrandedDecl& other)
    : body(other.body),
      source(other.source) {
  if (body.is<Resolver::ResolvedDecl>()) {
    brand = kj::addRef(*other.brand);
  }
}